

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawString
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  Mode MVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  Pixel PVar5;
  int iVar6;
  char *pcVar7;
  ushort uVar8;
  char *pcVar9;
  uint32_t js;
  int iVar10;
  uint32_t uVar11;
  int iVar12;
  int iVar13;
  uint32_t is;
  uint32_t uVar14;
  int iVar15;
  
  MVar1 = this->nPixelMode;
  if (MVar1 != CUSTOM) {
    this->nPixelMode = ((uint)col.field_0 < 0xff000000) + MASK;
  }
  if (sText->_M_string_length != 0) {
    pcVar7 = (sText->_M_dataplus)._M_p;
    pcVar9 = pcVar7 + sText->_M_string_length;
    iVar13 = 0;
    iVar12 = 0;
    do {
      sVar2 = (short)*pcVar7;
      if (sVar2 == 10) {
        iVar12 = iVar12 + scale * 8;
        iVar13 = 0;
      }
      else {
        uVar8 = sVar2 - 0x11;
        if (-1 < (short)(sVar2 - 0x20U)) {
          uVar8 = sVar2 - 0x20U;
        }
        iVar3 = (short)((sVar2 - (uVar8 & 0xfff0)) + -0x20) * 8;
        iVar10 = ((int)(short)uVar8 >> 4) * 8;
        if (scale < 2) {
          iVar6 = 0;
          do {
            iVar15 = 0;
            do {
              PVar5 = Sprite::GetPixel(this->fontSprite,iVar6 + iVar3,iVar15 + iVar10);
              if (PVar5.field_0._0_1_ != '\0') {
                (*this->_vptr_PixelGameEngine[5])
                          (this,(ulong)(uint)(x + iVar13 + iVar6),(ulong)(uint)(y + iVar12 + iVar15)
                           ,(ulong)(uint)col.field_0);
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 != 8);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 8);
        }
        else {
          iVar6 = 0;
          do {
            iVar4 = 0;
            iVar15 = y + iVar12;
            do {
              PVar5 = Sprite::GetPixel(this->fontSprite,iVar3 + iVar6,iVar4 + iVar10);
              if (PVar5.field_0._0_1_ != '\0') {
                uVar14 = 0;
                do {
                  uVar11 = 0;
                  do {
                    (*this->_vptr_PixelGameEngine[5])
                              (this,(ulong)(iVar6 * scale + x + iVar13 + uVar14),
                               (ulong)(iVar15 + uVar11),(ulong)(uint)col.field_0);
                    uVar11 = uVar11 + 1;
                  } while (scale != uVar11);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != scale);
              }
              iVar4 = iVar4 + 1;
              iVar15 = iVar15 + scale;
            } while (iVar4 != 8);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 8);
        }
        iVar13 = iVar13 + scale * 8;
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar9);
  }
  this->nPixelMode = MVar1;
  return;
}

Assistant:

void PixelGameEngine::DrawString(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;
		// Thanks @tucna, spotted bug with col.ALPHA :P
		if (m != Pixel::CUSTOM) // Thanks @Megarev, required for "shaders"
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								for (uint32_t is = 0; is < scale; is++)
									for (uint32_t js = 0; js < scale; js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += 8 * scale;
			}
		}
		SetPixelMode(m);
	}